

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::
     BitpackingWriter::WriteDeltaFor
               (hugeint_t *values,bool *validity,bitpacking_width_t width,
               hugeint_t frame_of_reference,hugeint_t delta_offset,hugeint_t *original_values,
               idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  ulong uVar6;
  uint64_t *puVar7;
  bitpacking_metadata_encoded_t encoded_value;
  uhugeint_t *in;
  ulong uVar8;
  ulong value;
  ulong uVar9;
  ulong uVar10;
  hugeint_t local_248;
  uhugeint_t local_238;
  undefined1 local_228 [504];
  
  iVar5 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar5 = (count - uVar4) + 0x20;
  }
  value = (ulong)width;
  uVar6 = iVar5 * value >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,
             uVar6 + 0x30,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar3 = *(long *)((long)data_ptr + 0x48);
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x4000000;
  puVar7 = *(uint64_t **)((long)data_ptr + 0x40);
  *puVar7 = frame_of_reference.lower;
  puVar7[1] = frame_of_reference.upper;
  *(uint64_t **)((long)data_ptr + 0x40) = puVar7 + 2;
  hugeint_t::hugeint_t(&local_248,value);
  puVar7 = *(uint64_t **)((long)data_ptr + 0x40);
  *puVar7 = local_248.lower;
  puVar7[1] = local_248.upper;
  *(uint64_t **)((long)data_ptr + 0x40) = puVar7 + 2;
  puVar7[2] = delta_offset.lower;
  puVar7[3] = delta_offset.upper;
  puVar7 = puVar7 + 4;
  *(uint64_t **)((long)data_ptr + 0x40) = puVar7;
  uVar9 = count & 0xffffffffffffffe0;
  if (uVar9 != 0) {
    uVar8 = 0;
    uVar10 = 0;
    in = (uhugeint_t *)values;
    do {
      HugeIntPacker::Pack(in,(uint32_t *)((uVar8 >> 3) + (long)puVar7),width);
      uVar10 = uVar10 + 0x20;
      in = in + 0x20;
      uVar8 = uVar8 + (ulong)width * 0x20;
    } while (uVar10 < uVar9);
  }
  if ((count & 0x1f) != 0) {
    hugeint_t::hugeint_t((hugeint_t *)&local_238,0);
    switchD_00570541::default(local_228,0,0x1f0);
    switchD_00b1522a::default(&local_238,values + uVar9,(ulong)(((uint)count & 0x1f) << 4));
    HugeIntPacker::Pack(&local_238,(uint32_t *)((long)puVar7 + (value * uVar9 >> 3)),width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar6;
  UpdateStats((BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,
              count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}